

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O2

float read_int(istream *is)

{
  runtime_error *this;
  float num;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::istream::_M_extract<float>((float *)is);
  if ((char)((*(uint *)(is + *(long *)(*(long *)is + -0x18) + 0x20) & 2) >> 1) != '\0' ||
      (*(uint *)(is + *(long *)(*(long *)is + -0x18) + 0x20) & 5) == 0) {
    return 0.0;
  }
  std::ios::clear((int)*(long *)(*(long *)is + -0x18) + (int)is);
  std::istream::unget();
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&line);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_58,"\'",&line);
  std::operator+(&local_38,&local_58,"\' is not a valid number.");
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float read_int(std::istream& is)
{
	float num{ 0 };
	is >> num;
	if (!is)
	{
		if (!is.eof())
		{
			is.clear();
			is.unget();
			std::string line;
			std::getline(is, line);
			throw std::runtime_error("'" + line + "' is not a valid number.");
		}
	}
	return num;
}